

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomButtonGroups::read(DomButtonGroups *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  DomButtonGroup *this_00;
  char16_t *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QStringView QVar2;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    do {
      iVar1 = QXmlStreamReader::readNext();
      if (iVar1 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar2.m_data = L"buttongroup";
        QVar2.m_size = 0xb;
        __nbytes_00 = L"buttongroup";
        iVar1 = QtPrivate::compareStrings(local_48,QVar2,CaseInsensitive);
        if (iVar1 == 0) {
          this_00 = (DomButtonGroup *)operator_new(0x50);
          (this_00->m_attr_name).d.d = (Data *)0x0;
          (this_00->m_attr_name).d.ptr = (char16_t *)0x0;
          (this_00->m_attr_name).d.size = 0;
          this_00->m_has_attr_name = false;
          *(undefined3 *)&this_00->field_0x19 = 0;
          this_00->m_children = 0;
          (this_00->m_property).d.d = (Data *)0x0;
          (this_00->m_property).d.ptr = (DomProperty **)0x0;
          (this_00->m_property).d.size = 0;
          (this_00->m_attribute).d.d = (Data *)0x0;
          (this_00->m_attribute).d.ptr = (DomProperty **)0x0;
          (this_00->m_attribute).d.size = 0;
          DomButtonGroup::read(this_00,__fd,__buf_00,(size_t)__nbytes_00);
          local_60.d.d = (Data *)this_00;
          QtPrivate::QPodArrayOps<DomButtonGroup*>::emplace<DomButtonGroup*&>
                    ((QPodArrayOps<DomButtonGroup*> *)&this->m_buttonGroup,
                     (this->m_buttonGroup).d.size,(DomButtonGroup **)&local_60);
          QList<DomButtonGroup_*>::end(&this->m_buttonGroup);
        }
        else {
          local_78.a.m_size = 0x13;
          local_78.a.m_data = "Unexpected element ";
          local_78.b = &local_48;
          QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                    (&local_60,&local_78);
          QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
          if ((DomButtonGroup *)local_60.d.d != (DomButtonGroup *)0x0) {
            LOCK();
            *(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d =
                 *(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&(local_60.d.d)->super_QArrayData)->d).d == 0) {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else if (iVar1 == 5) break;
      iVar1 = QXmlStreamReader::error();
    } while (iVar1 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomButtonGroups::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"buttongroup"_s, Qt::CaseInsensitive)) {
                auto *v = new DomButtonGroup();
                v->read(reader);
                m_buttonGroup.append(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}